

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

Ssw_Sml_t * Ssw_SmlSimulateComb(Aig_Man_t *pAig,int nWords)

{
  Ssw_Sml_t *p;
  
  p = (Ssw_Sml_t *)malloc((long)nWords * 4 * (long)pAig->vObjs->nSize + 0x30);
  memset(p,0,(long)nWords * 4 + 0x30);
  p->pAig = pAig;
  p->nPref = 0;
  p->nFrames = 1;
  p->nWordsFrame = nWords;
  p->nWordsTotal = nWords;
  p->nWordsPref = 0;
  Ssw_SmlInitialize(p,0);
  Ssw_SmlSimulateOne(p);
  return p;
}

Assistant:

Ssw_Sml_t * Ssw_SmlSimulateComb( Aig_Man_t * pAig, int nWords )
{
    Ssw_Sml_t * p;
    p = Ssw_SmlStart( pAig, 0, 1, nWords );
    Ssw_SmlInitialize( p, 0 );
    Ssw_SmlSimulateOne( p );
    return p;
}